

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall addrman_tests::addrman_ports::test_method(addrman_ports *this)

{
  long lVar1;
  CService ipIn;
  CService ipIn_00;
  CService ipIn_01;
  __single_object _Var2;
  bool bVar3;
  bool bVar4;
  int32_t iVar5;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> time;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  CAddress *pCVar7;
  iterator pvVar8;
  CAddress *pCVar9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string file;
  const_string file_00;
  initializer_list<CAddress> __l;
  const_string file_01;
  const_string file_02;
  initializer_list<CAddress> __l_00;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  undefined4 uVar10;
  undefined4 uVar11;
  char *pcVar12;
  undefined8 in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  __single_object addrman;
  undefined1 local_238 [32];
  _Prime_rehash_policy local_218;
  undefined1 auStack_208 [8];
  CService local_200;
  string local_1d8;
  CAddress addr_ret3;
  undefined **local_178 [2];
  undefined1 *local_168;
  char *local_160;
  uint16_t local_158;
  duration local_150;
  ServiceFlags SStack_148;
  CAddress addr_ret2;
  CService local_f8;
  CService addr1_port;
  CService local_a8;
  CService addr1;
  CNetAddr source;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  local_178[0] = (undefined **)CONCAT44(local_178[0]._4_4_,iVar5);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)&addrman,(bool *)&EMPTY_NETGROUPMAN,(int *)&DETERMINISTIC);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_178,"252.2.2.2",(allocator<char> *)&addr_ret2);
  ResolveIP(&source,(string *)local_178);
  std::__cxx11::string::~string((string *)local_178);
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x73;
  file.m_begin = (iterator)&local_250;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_260,msg);
  local_178[1]._0_1_ = '\0';
  local_178[0] = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_268 = "";
  addr_ret2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pCVar7 = &addr_ret2;
  pCVar9 = &addr_ret3;
  addr_ret3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)(uint)addr_ret3.super_CService.super_CNetAddr.m_addr._union._4_4_ << 0x20);
  pcVar12 = "0U";
  uVar10 = 0xb4ecd9;
  uVar11 = 0;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_178,&local_270,0x73,1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_178,"250.1.1.1",(allocator<char> *)&addr_ret2);
  ResolveService(&addr1,(string *)local_178,0x208d);
  std::__cxx11::string::~string((string *)local_178);
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pCVar7;
  msg_00.m_begin = pvVar6;
  file_00.m_end = (iterator)0x77;
  file_00.m_begin = (iterator)&local_280;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_290,
             msg_00);
  _Var2 = addrman;
  CService::CService(&local_a8,&addr1);
  ipIn.super_CNetAddr.m_addr._union._4_4_ = uVar11;
  ipIn.super_CNetAddr.m_addr._union._0_4_ = uVar10;
  ipIn.super_CNetAddr.m_addr._union._8_8_ = pCVar9;
  ipIn.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffffc30;
  ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffc30 >> 0x20);
  ipIn._32_8_ = in_stack_fffffffffffffc38;
  CAddress::CAddress((CAddress *)local_178,ipIn,(ServiceFlags)&local_a8);
  __l._M_len = 1;
  __l._M_array = (iterator)local_178;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_238,__l,
             (allocator_type *)&local_1d8);
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)local_238,&source,(seconds)0x0
                      );
  pCVar7 = &addr_ret3;
  addr_ret3.super_CService.super_CNetAddr.m_addr._union.direct[0] = bVar3;
  addr_ret3.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr_ret3.super_CService.super_CNetAddr.m_addr._size = 0;
  addr_ret3.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  addr_ret2.super_CService.super_CNetAddr._24_8_ = &addr1_port;
  addr1_port.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "addrman->Add({CAddress(addr1, NODE_NONE)}, source)";
  addr1_port.super_CNetAddr.m_addr._union._8_8_ =
       (long)"addrman->Add({CAddress(addr1, NODE_NONE)}, source)" + 0x32;
  addr_ret2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr_ret2.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr_ret2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr_ret2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_298 = "";
  pvVar6 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)pCVar7,(lazy_ostream *)&addr_ret2,1,0,WARN,(check_type)pCVar9,
             (size_t)&local_2a0,0x77);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&addr_ret3.super_CService.super_CNetAddr.m_addr._size);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_238);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_178);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_a8);
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar6;
  file_01.m_end = (iterator)0x78;
  file_01.m_begin = (iterator)&local_2b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2c0,
             msg_01);
  local_178[1]._0_1_ = '\0';
  local_178[0] = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2c8 = "";
  addr_ret2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pCVar9 = &addr_ret2;
  addr_ret3.super_CService.super_CNetAddr.m_addr._union._0_4_ = 1;
  pcVar12 = "1U";
  uVar10 = 0xb4ecd9;
  uVar11 = 0;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_178,&local_2d0,0x78,1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_178,"250.1.1.1",(allocator<char> *)&addr_ret2);
  ResolveService(&addr1_port,(string *)local_178,0x208e);
  std::__cxx11::string::~string((string *)local_178);
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pCVar9;
  msg_02.m_begin = pvVar6;
  file_02.m_end = (iterator)0x7b;
  file_02.m_begin = (iterator)&local_2e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2f0,
             msg_02);
  _Var2 = addrman;
  CService::CService(&local_f8,&addr1_port);
  ipIn_00.super_CNetAddr.m_addr._union._4_4_ = uVar11;
  ipIn_00.super_CNetAddr.m_addr._union._0_4_ = uVar10;
  ipIn_00.super_CNetAddr.m_addr._union._8_8_ = pCVar7;
  ipIn_00.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_00.super_CNetAddr.m_net = (int)in_stack_fffffffffffffc30;
  ipIn_00.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffc30 >> 0x20);
  ipIn_00._32_8_ = in_stack_fffffffffffffc38;
  CAddress::CAddress((CAddress *)local_178,ipIn_00,(ServiceFlags)&local_f8);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_178;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_238,__l_00,
             (allocator_type *)&local_360);
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)local_238,&source,(seconds)0x0
                      );
  pCVar9 = &addr_ret3;
  addr_ret3.super_CService.super_CNetAddr.m_addr._union.direct[0] = bVar3;
  addr_ret3.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr_ret3.super_CService.super_CNetAddr.m_addr._size = 0;
  addr_ret3.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  local_1d8._M_dataplus._M_p = "addrman->Add({CAddress(addr1_port, NODE_NONE)}, source)";
  local_1d8._M_string_length = 0xb4ee86;
  addr_ret2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr_ret2.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr_ret2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr_ret2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2f8 = "";
  pvVar6 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  addr_ret2.super_CService.super_CNetAddr._24_8_ = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)pCVar9,(lazy_ostream *)&addr_ret2,1,0,WARN,(check_type)pCVar7,
             (size_t)&local_300,0x7b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&addr_ret3.super_CService.super_CNetAddr.m_addr._size);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_238);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_178);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8);
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar6;
  file_03.m_end = (iterator)0x7c;
  file_03.m_begin = (iterator)&local_310;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_320,
             msg_03);
  local_178[1]._0_1_ = '\0';
  local_178[0] = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_328 = "";
  addr_ret2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pCVar7 = &addr_ret2;
  addr_ret3.super_CService.super_CNetAddr.m_addr._union._0_4_ = 2;
  pcVar12 = "2U";
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_178,&local_330,0x7c,1,2,pCVar7,0xb4ecd9);
  addr_ret3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&addr_ret3.nServices;
  addr_ret3.super_CService.super_CNetAddr.m_addr._union._8_8_ = 1;
  addr_ret3.super_CService.super_CNetAddr.m_addr._size = 0;
  addr_ret3.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  addr_ret3.super_CService.super_CNetAddr.m_net = NET_UNROUTABLE;
  addr_ret3.super_CService.super_CNetAddr.m_scope_id = 0;
  addr_ret3.super_CService.port = 0;
  addr_ret3.super_CService._34_6_ = 0x3f80;
  addr_ret3.nTime.__d.__r = (duration)0;
  addr_ret3.nServices = NODE_NONE;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_178,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)&addr_ret3);
  addr_ret2.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       CONCAT71(local_178[1]._1_7_,local_178[1]._0_1_);
  uVar10 = local_168._0_4_;
  local_168 = (undefined1 *)((ulong)local_168 & 0xffffffff00000000);
  addr_ret2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)local_178[0];
  addr_ret2.super_CService.super_CNetAddr.m_addr._size = uVar10;
  addr_ret2.super_CService.super_CNetAddr._24_8_ = local_160;
  addr_ret2.super_CService.port = local_158;
  addr_ret2.nTime.__d.__r = (duration)(duration)local_150.__r;
  addr_ret2.nServices = SStack_148;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_178);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&addr_ret3);
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)pCVar7;
  msg_04.m_begin = pvVar6;
  file_04.m_end = (iterator)0x7e;
  file_04.m_begin = (iterator)&local_340;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_350,
             msg_04);
  CService::ToStringAddrPort_abi_cxx11_((string *)local_178,&addr_ret2.super_CService);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_178,"250.1.1.1:8333");
  bVar4 = true;
  if (!bVar3) {
    CService::ToStringAddrPort_abi_cxx11_(&local_1d8,&addr_ret2.super_CService);
    bVar4 = std::operator==(&local_1d8,"250.1.1.1:8334");
  }
  local_238[0] = bVar4;
  local_238._8_8_ = (element_type *)0x0;
  local_238._16_8_ = (pointer)0x0;
  local_360 = 
  "addr_ret2.ToStringAddrPort() == \"250.1.1.1:8333\" || addr_ret2.ToStringAddrPort() == \"250.1.1.1:8334\""
  ;
  local_358 = "";
  addr_ret3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr_ret3.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr_ret3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr_ret3.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_368 = "";
  uVar10 = 0;
  uVar11 = 0;
  pvVar6 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  addr_ret3.super_CService.super_CNetAddr._24_8_ = (allocator_type *)&local_360;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_238,(lazy_ostream *)&addr_ret3,1,0,WARN,(check_type)pCVar9,
             (size_t)&local_370,0x7e);
  boost::detail::shared_count::~shared_count((shared_count *)(local_238 + 0x10));
  if (!bVar3) {
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  std::__cxx11::string::~string((string *)local_178);
  _Var2 = addrman;
  CService::CService((CService *)(auStack_208 + 8),&addr1_port);
  ipIn_01.super_CNetAddr.m_addr._union._4_4_ = uVar11;
  ipIn_01.super_CNetAddr.m_addr._union._0_4_ = uVar10;
  ipIn_01.super_CNetAddr.m_addr._union._8_8_ = pCVar9;
  ipIn_01.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_01.super_CNetAddr.m_net = (int)in_stack_fffffffffffffc30;
  ipIn_01.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffc30 >> 0x20);
  ipIn_01._32_8_ = in_stack_fffffffffffffc38;
  CAddress::CAddress((CAddress *)local_178,ipIn_01,(ServiceFlags)(auStack_208 + 8));
  time = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  AddrMan::Good((AddrMan *)
                _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(CService *)local_178,
                (NodeSeconds)time.__d.__r);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_178);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)(auStack_208 + 8));
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar6;
  file_05.m_end = (iterator)0x83;
  file_05.m_begin = (iterator)&local_380;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_390,
             msg_05);
  local_178[1]._0_1_ = '\0';
  local_178[0] = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_398 = "";
  addr_ret3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pCVar7 = &addr_ret3;
  local_238._0_4_ = 2;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_178,&local_3a0,0x83,1,2,pCVar7,0xb4ecd9,(assertion_result *)local_238,"2U");
  local_238._0_8_ = auStack_208;
  local_238._8_8_ = &DAT_00000001;
  local_238._16_8_ = (pointer)0x0;
  local_238._24_8_ = (_Bit_pointer)0x0;
  local_218._M_max_load_factor = 1.0;
  local_218._4_4_ = 0;
  local_218._M_next_resize = 0;
  auStack_208 = (undefined1  [8])0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)local_178,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)local_238);
  addr_ret3.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       CONCAT71(local_178[1]._1_7_,local_178[1]._0_1_);
  uVar10 = local_168._0_4_;
  local_168 = (undefined1 *)((ulong)local_168 & 0xffffffff00000000);
  addr_ret3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)local_178[0];
  addr_ret3.super_CService.super_CNetAddr.m_addr._size = uVar10;
  addr_ret3.super_CService.super_CNetAddr._24_8_ = local_160;
  addr_ret3.super_CService.port = local_158;
  addr_ret3.nTime.__d.__r = (duration)(duration)local_150.__r;
  addr_ret3.nServices = SStack_148;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_178);
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_238);
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)pCVar7;
  msg_06.m_begin = pvVar6;
  file_06.m_end = (iterator)0x86;
  file_06.m_begin = (iterator)&local_3b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3c0,
             msg_06);
  local_178[1]._0_1_ = '\0';
  local_178[0] = &PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  CService::ToStringAddrPort_abi_cxx11_((string *)local_238,&addr_ret3.super_CService);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[15]>
            (local_178,&stack0xfffffffffffffc30,0x86,1,2,local_238,0xb4eefb,"250.1.1.1:8333",
             "\"250.1.1.1:8333\"");
  std::__cxx11::string::~string((string *)local_238);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_ret3);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_ret2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1_port);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source.m_addr);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_ports)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    CNetAddr source = ResolveIP("252.2.2.2");

    BOOST_CHECK_EQUAL(addrman->Size(), 0U);

    // Test 7; Addr with same IP but diff port does not replace existing addr.
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    CService addr1_port = ResolveService("250.1.1.1", 8334);
    BOOST_CHECK(addrman->Add({CAddress(addr1_port, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 2U);
    auto addr_ret2 = addrman->Select().first;
    BOOST_CHECK(addr_ret2.ToStringAddrPort() == "250.1.1.1:8333" || addr_ret2.ToStringAddrPort() == "250.1.1.1:8334");

    // Test: Add same IP but diff port to tried table; this converts the entry with
    // the specified port to tried, but not the other.
    addrman->Good(CAddress(addr1_port, NODE_NONE));
    BOOST_CHECK_EQUAL(addrman->Size(), 2U);
    bool new_only = true;
    auto addr_ret3 = addrman->Select(new_only).first;
    BOOST_CHECK_EQUAL(addr_ret3.ToStringAddrPort(), "250.1.1.1:8333");
}